

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall
wasm::Literal::ltU(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  BasicType BVar1;
  bool bVar2;
  
  BVar1 = wasm::Type::getBasic(&this->type);
  if (BVar1 == i64) {
    bVar2 = (this->field_0).func.super_IString.str._M_len <
            (other->field_0).func.super_IString.str._M_len;
  }
  else {
    if (BVar1 != i32) {
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                         ,0x5d7);
    }
    bVar2 = (uint)(this->field_0).i32 < (uint)(other->field_0).i32;
  }
  *(uint *)&__return_storage_ptr__->field_0 = (uint)bVar2;
  (__return_storage_ptr__->type).id = 2;
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::ltU(const Literal& other) const {
  switch (type.getBasic()) {
    case Type::i32:
      return Literal(uint32_t(i32) < uint32_t(other.i32));
    case Type::i64:
      return Literal(uint64_t(i64) < uint64_t(other.i64));
    default:
      WASM_UNREACHABLE("unexpected type");
  }
}